

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

QPDFObjectHandle __thiscall
QPDFObjectHandle::newArray
          (QPDFObjectHandle *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *items
          )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  QPDFObjectHandle QVar2;
  QPDF_Array local_38;
  
  QPDF_Array::QPDF_Array(&local_38,items);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eaaf0;
  p_Var1[1]._vptr__Sp_counted_base =
       (_func_int **)
       local_38.sp._M_t.
       super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
       super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
       super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
  local_38.sp._M_t.
  super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
  super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl =
       (__uniq_ptr_data<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>,_true,_true>)
       (__uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>)0x0;
  *(pointer *)&p_Var1[1]._M_use_count =
       local_38.elements.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
       _M_impl.super__Vector_impl_data._M_start;
  p_Var1[2]._vptr__Sp_counted_base =
       (_func_int **)
       local_38.elements.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)&p_Var1[2]._M_use_count =
       local_38.elements.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.elements.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.elements.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.elements.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)&p_Var1[4]._vptr__Sp_counted_base = 8;
  p_Var1[4]._M_use_count = 0;
  p_Var1[4]._M_weak_count = 0;
  p_Var1[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[5]._M_use_count = 0;
  p_Var1[5]._M_weak_count = 0;
  p_Var1[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[6]._M_use_count = -1;
  p_Var1[6]._M_weak_count = -1;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_38.elements);
  std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
            (&local_38.sp);
  (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newArray(std::vector<QPDFObjectHandle> const& items)
{
    return {QPDFObject::create<QPDF_Array>(items)};
}